

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadBone(OgreBinarySerializer *this,Skeleton *skeleton)

{
  uint16_t uVar1;
  Bone *this_00;
  Logger *this_01;
  ostream *poVar2;
  DeadlyImportError *this_02;
  Bone *bone;
  string local_1c8;
  string local_1a8 [11];
  
  this_00 = (Bone *)operator_new(0xf8);
  Bone::Bone(this_00);
  bone = this_00;
  ReadLine_abi_cxx11_(local_1a8,this);
  std::__cxx11::string::operator=((string *)&this_00->name,(string *)local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  uVar1 = Read<unsigned_short>(this);
  this_00->id = uVar1;
  ReadVector(this,&this_00->position);
  ReadQuaternion(this,&this_00->rotation);
  if (0x24 < this->m_currentLen) {
    ReadVector(this,&this_00->scale);
  }
  if ((long)(skeleton->bones).
            super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(skeleton->bones).
            super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 == (ulong)this_00->id) {
    this_01 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[5]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [5])0x611064);
    poVar2 = (ostream *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        local_1a8,(unsigned_short *)this_00);
    std::operator<<(poVar2," ");
    std::operator<<(poVar2,(string *)&this_00->name);
    std::__cxx11::stringbuf::str();
    Logger::debug(this_01,local_1c8._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::push_back
              (&skeleton->bones,&bone);
    return;
  }
  this_02 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::operator<<((ostream *)local_1a8,
                  "Ogre Skeleton bone indexes not contiguous. Error at bone index ");
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
             (unsigned_short *)this_00);
  std::__cxx11::stringbuf::str();
  DeadlyImportError::DeadlyImportError(this_02,&local_1c8);
  __cxa_throw(this_02,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreBinarySerializer::ReadBone(Skeleton *skeleton)
{
    Bone *bone = new Bone();
    bone->name = ReadLine();
    bone->id = Read<uint16_t>();

    // Pos and rot
    ReadVector(bone->position);
    ReadQuaternion(bone->rotation);

    // Scale (optional)
    if (m_currentLen > MSTREAM_BONE_SIZE_WITHOUT_SCALE)
        ReadVector(bone->scale);

    // Bone indexes need to start from 0 and be contiguous
    if (bone->id != skeleton->bones.size()) {
        throw DeadlyImportError(Formatter::format() << "Ogre Skeleton bone indexes not contiguous. Error at bone index " << bone->id);
    }

    ASSIMP_LOG_DEBUG_F( "    ", bone->id, " ", bone->name);

    skeleton->bones.push_back(bone);
}